

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

void __thiscall wasm::LocalGraphFlower::flow(LocalGraphFlower *this)

{
  vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>> *this_00;
  pointer pvVar1;
  pointer pFVar2;
  iterator __position;
  pointer ppLVar3;
  bool bVar4;
  undefined1 auVar5 [8];
  LocalSet *pLVar6;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar7;
  iterator __begin5;
  pointer ppLVar8;
  pointer pFVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 local_88 [8];
  vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
  allGets;
  LocalGet *get_1;
  LocalSet *local_50;
  LocalSet *set;
  pointer local_40;
  LocalSet *local_38;
  LocalGet *get;
  
  prepareFlowBlocks(this);
  set = (LocalSet *)Function::getNumLocals(this->func);
  pFVar9 = (this->flowBlocks).
           super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->flowBlocks).
           super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar9 != pFVar2) {
    do {
      std::
      vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
      ::vector((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                *)local_88,(size_type)set,(allocator_type *)&local_38);
      uVar10 = (uint)((ulong)((long)(pFVar9->actions).
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar9->actions).
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_40 = pFVar9;
      if (0 < (int)uVar10) {
        uVar11 = (ulong)(uVar10 & 0x7fffffff);
        do {
          auVar5 = local_88;
          pLVar6 = (LocalSet *)
                   (pFVar9->actions).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11 - 1];
          local_38 = (LocalSet *)0x0;
          if ((((SpecificExpression<(wasm::Expression::Id)8> *)
               &pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>)->super_Expression)._id ==
              LocalGetId) {
            local_38 = pLVar6;
          }
          if (local_38 == (LocalSet *)0x0) {
            if ((((SpecificExpression<(wasm::Expression::Id)8> *)
                 &pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>)->super_Expression)._id
                != LocalSetId) {
              pLVar6 = (LocalSet *)0x0;
            }
            local_50 = pLVar6;
            if (pLVar6 != (LocalSet *)0x0) {
              uVar10 = pLVar6->index;
              ppLVar3 = (((pointer)((long)local_88 + (ulong)uVar10 * 0x18))->
                        super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              for (ppLVar8 = (((pointer)((long)local_88 + (ulong)uVar10 * 0x18))->
                             super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                             )._M_impl.super__Vector_impl_data._M_start; ppLVar8 != ppLVar3;
                  ppLVar8 = ppLVar8 + 1) {
                allGets.
                super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppLVar8;
                pSVar7 = &std::__detail::
                          _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)this->getSetsMap,
                                       (key_type *)
                                       &allGets.
                                        super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ;
                SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::insert(pSVar7,&local_50);
              }
              pvVar1 = (pointer)((long)auVar5 + (ulong)uVar10 * 0x18);
              ppLVar8 = (pvVar1->
                        super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pFVar9 = local_40;
              if ((pvVar1->super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish != ppLVar8) {
                (pvVar1->super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                _M_impl.super__Vector_impl_data._M_finish = ppLVar8;
              }
            }
          }
          else {
            this_00 = (vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>> *)
                      ((long)local_88 + (ulong)local_38->index * 0x18);
            __position._M_current = *(LocalGet ***)(this_00 + 8);
            if (__position._M_current == *(LocalGet ***)(this_00 + 0x10)) {
              std::vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>>::
              _M_realloc_insert<wasm::LocalGet*const&>(this_00,__position,(LocalGet **)&local_38);
            }
            else {
              *__position._M_current = (LocalGet *)local_38;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
          bVar4 = 1 < (long)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar4);
      }
      if (set != (LocalSet *)0x0) {
        pLVar6 = (LocalSet *)0x0;
        do {
          ppLVar8 = (((pointer)((long)local_88 + pLVar6 * 0x18))->
                    super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          ppLVar3 = (((pointer)((long)local_88 + pLVar6 * 0x18))->
                    super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>)._M_impl
                    .super__Vector_impl_data._M_finish;
          if (ppLVar8 != ppLVar3) {
            if (((this->hasSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[(ulong)pLVar6 >> 6]
                 >> ((ulong)pLVar6 & 0x3f) & 1) == 0) {
              for (; ppLVar8 != ppLVar3; ppLVar8 = ppLVar8 + 1) {
                local_38 = (LocalSet *)*ppLVar8;
                pSVar7 = &std::__detail::
                          _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)this->getSetsMap,(key_type *)&local_38)->
                          super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ;
                local_50 = (LocalSet *)0x0;
                SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::insert(pSVar7,&local_50);
              }
            }
            else {
              flowBackFromStartOfBlock
                        (this,local_40,(Index)pLVar6,
                         (vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                         ((long)local_88 + pLVar6 * 0x18));
            }
          }
          pLVar6 = (LocalSet *)(ulong)((Index)pLVar6 + 1);
        } while (pLVar6 < set);
      }
      std::
      vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
      ::~vector((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                 *)local_88);
      pFVar9 = local_40 + 1;
    } while (pFVar9 != pFVar2);
  }
  return;
}

Assistant:

void flow() {
    prepareFlowBlocks();

    auto numLocals = func->getNumLocals();

    for (auto& block : flowBlocks) {
#ifdef LOCAL_GRAPH_DEBUG
      std::cout << "basic block " << &block << " :\n";
      for (auto& action : block.actions) {
        std::cout << "  action: " << *action << '\n';
      }
      for (auto& val : block.lastSets) {
        std::cout << "  last set " << val.second << '\n';
      }
#endif

      // Track all gets in this block, by index.
      std::vector<std::vector<LocalGet*>> allGets(numLocals);

      // go through the block, finding each get and adding it to its index,
      // and seeing how sets affect that
      auto& actions = block.actions;

      // move towards the front, handling things as we go
      for (int i = int(actions.size()) - 1; i >= 0; i--) {
        auto* action = actions[i];
        if (auto* get = action->dynCast<LocalGet>()) {
          allGets[get->index].push_back(get);
        } else if (auto* set = action->dynCast<LocalSet>()) {
          // This set is the only set for all those gets.
          auto& gets = allGets[set->index];
          for (auto* get : gets) {
            getSetsMap[get].insert(set);
          }
          gets.clear();
        }
      }
      // If anything is left, we must flow it back through other blocks. we
      // can do that for all gets as a whole, they will get the same results.
      for (Index index = 0; index < numLocals; index++) {
        auto& gets = allGets[index];
        if (gets.empty()) {
          continue;
        }
        if (!hasSet[index]) {
          // This local index has no sets, so we know all gets will end up
          // reaching the entry block. Do that here as an optimization to avoid
          // flowing through the (potentially very many) blocks in the function.
          //
          // Note that we may be in unreachable code, and if so, we might add
          // the entry values when they are not actually relevant. That is, we
          // are not precise in the case of unreachable code. This can be
          // confusing when debugging, but it does not have any downside for
          // optimization (since unreachable code should be removed anyhow).
          for (auto* get : gets) {
            getSetsMap[get].insert(nullptr);
          }
          continue;
        }

        flowBackFromStartOfBlock(&block, index, gets);
      }
    }
  }